

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O0

QTransform * __thiscall
QGraphicsItemPrivate::TransformData::computedFullTransform
          (TransformData *this,QTransform *postmultiplyTransform)

{
  bool bVar1;
  long i_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  QTransform *in_RDX;
  QTransform *in_RSI;
  QMatrix4x4 *in_RDI;
  long in_FS_OFFSET;
  int i;
  QMatrix4x4 m;
  QMatrix4x4 *pQVar4;
  int local_b4;
  undefined1 local_a0 [84];
  undefined1 local_4c [68];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)in_RSI[0x88] & 1) == 0) {
    pQVar4 = in_RDI;
    memcpy(in_RDI,&DAT_00b42da8,0x50);
    memcpy(pQVar4,in_RSI,0x50);
    bVar1 = QList<QGraphicsTransform_*>::isEmpty((QList<QGraphicsTransform_*> *)0x99386e);
    if (!bVar1) {
      memcpy(local_4c,&DAT_00b42df8,0x44);
      QMatrix4x4::QMatrix4x4(pQVar4);
      local_b4 = 0;
      while( true ) {
        i_00 = (long)local_b4;
        qVar2 = QList<QGraphicsTransform_*>::size((QList<QGraphicsTransform_*> *)(in_RSI + 0x70));
        if (qVar2 <= i_00) break;
        ppQVar3 = QList<QGraphicsTransform_*>::at((QList<QGraphicsTransform_*> *)pQVar4,i_00);
        (**(code **)(*(long *)*ppQVar3 + 0x60))(*ppQVar3,local_4c);
        local_b4 = local_b4 + 1;
      }
      QMatrix4x4::toTransform();
      QTransform::operator*=((QTransform *)pQVar4,(QTransform *)local_a0);
    }
    QTransform::translate(*(double *)(in_RSI + 0x60),*(double *)(in_RSI + 0x68));
    QTransform::rotate(*(double *)(in_RSI + 0x58),(Axis)pQVar4);
    QTransform::scale(*(double *)(in_RSI + 0x50),*(double *)(in_RSI + 0x50));
    QTransform::translate(-*(double *)(in_RSI + 0x60),-*(double *)(in_RSI + 0x68));
    if (in_RDX != (QTransform *)0x0) {
      QTransform::operator*=((QTransform *)pQVar4,in_RDX);
    }
  }
  else {
    pQVar4 = in_RDI;
    if ((in_RDX == (QTransform *)0x0) ||
       (bVar1 = QTransform::isIdentity((QTransform *)0x9937d5), bVar1)) {
      memcpy(pQVar4,in_RSI,0x50);
    }
    else {
      bVar1 = QTransform::isIdentity((QTransform *)0x9937fe);
      if (bVar1) {
        memcpy(pQVar4,in_RDX,0x50);
      }
      else {
        QTransform::operator*((QTransform *)pQVar4,in_RSI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QTransform *)in_RDI;
}

Assistant:

QTransform computedFullTransform(QTransform *postmultiplyTransform = nullptr) const
    {
        if (onlyTransform) {
            if (!postmultiplyTransform || postmultiplyTransform->isIdentity())
                return transform;
            if (transform.isIdentity())
                return *postmultiplyTransform;
            return transform * *postmultiplyTransform;
        }

        QTransform x(transform);
        if (!graphicsTransforms.isEmpty()) {
            QMatrix4x4 m;
            for (int i = 0; i < graphicsTransforms.size(); ++i)
                graphicsTransforms.at(i)->applyTo(&m);
            x *= m.toTransform();
        }
        x.translate(xOrigin, yOrigin);
        x.rotate(rotation);
        x.scale(scale, scale);
        x.translate(-xOrigin, -yOrigin);
        if (postmultiplyTransform)
            x *= *postmultiplyTransform;
        return x;
    }